

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_generic_section.hpp
# Opt level: O3

error_code __thiscall
pstore::exchange::import_ns::
generic_section<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>
::end_object(generic_section<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>
             *this)

{
  section_kind sVar1;
  section_content **ppsVar2;
  tuple<pstore::repo::section_creation_dispatcher_*,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
  tVar3;
  pointer __p;
  error_code eVar4;
  error_or<pstore::repo::section_content_*> c;
  __uniq_ptr_impl<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
  local_50;
  _Head_base<0UL,_pstore::repo::generic_section_creation_dispatcher_*,_false> local_48;
  error_or<pstore::repo::section_content_*> local_40;
  not_null<const_pstore::repo::section_content_*> local_28;
  
  content_object(&local_40,this);
  if (local_40.has_error_ == true) {
    eVar4 = error_or<pstore::repo::section_content_*>::get_error(&local_40);
  }
  else {
    ppsVar2 = error_or<pstore::repo::section_content*>::
              value_storage_impl<pstore::error_or<pstore::repo::section_content*>const&,pstore::repo::section_content*const>
                        (&local_40);
    tVar3.
    super__Tuple_impl<0UL,_pstore::repo::section_creation_dispatcher_*,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
    .super__Head_base<0UL,_pstore::repo::section_creation_dispatcher_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_pstore::repo::section_creation_dispatcher_*,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
          )operator_new(0x18);
    sVar1 = this->kind_;
    local_28.ptr_ = *ppsVar2;
    gsl::not_null<const_pstore::repo::section_content_*>::ensure_invariant(&local_28);
    *(section_kind *)
     ((long)tVar3.
            super__Tuple_impl<0UL,_pstore::repo::section_creation_dispatcher_*,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
            .super__Head_base<0UL,_pstore::repo::section_creation_dispatcher_*,_false>._M_head_impl
     + 8) = sVar1;
    *(undefined ***)
     tVar3.
     super__Tuple_impl<0UL,_pstore::repo::section_creation_dispatcher_*,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
     .super__Head_base<0UL,_pstore::repo::section_creation_dispatcher_*,_false>._M_head_impl =
         &PTR__section_creation_dispatcher_0023ce90;
    *(section_content **)
     ((long)tVar3.
            super__Tuple_impl<0UL,_pstore::repo::section_creation_dispatcher_*,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
            .super__Head_base<0UL,_pstore::repo::section_creation_dispatcher_*,_false>._M_head_impl
     + 0x10) = local_28.ptr_;
    local_48._M_head_impl = (generic_section_creation_dispatcher *)0x0;
    local_50._M_t.
    super__Tuple_impl<0UL,_pstore::repo::section_creation_dispatcher_*,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
    .super__Head_base<0UL,_pstore::repo::section_creation_dispatcher_*,_false>._M_head_impl =
         (tuple<pstore::repo::section_creation_dispatcher_*,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
          )(tuple<pstore::repo::section_creation_dispatcher_*,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
            )tVar3.
             super__Tuple_impl<0UL,_pstore::repo::section_creation_dispatcher_*,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
             .super__Head_base<0UL,_pstore::repo::section_creation_dispatcher_*,_false>._M_head_impl
    ;
    std::
    vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>,std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>>>
    ::
    emplace_back<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>>
              ((vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>,std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>>>
                *)((this->out_).ptr_)->container,
               (unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
                *)&local_50);
    if ((_Tuple_impl<0UL,_pstore::repo::section_creation_dispatcher_*,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
         )local_50._M_t.
          super__Tuple_impl<0UL,_pstore::repo::section_creation_dispatcher_*,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
          .super__Head_base<0UL,_pstore::repo::section_creation_dispatcher_*,_false>._M_head_impl !=
        (section_creation_dispatcher *)0x0) {
      (**(code **)(*(long *)local_50._M_t.
                            super__Tuple_impl<0UL,_pstore::repo::section_creation_dispatcher_*,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
                            .
                            super__Head_base<0UL,_pstore::repo::section_creation_dispatcher_*,_false>
                            ._M_head_impl + 8))();
    }
    local_50._M_t.
    super__Tuple_impl<0UL,_pstore::repo::section_creation_dispatcher_*,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
    .super__Head_base<0UL,_pstore::repo::section_creation_dispatcher_*,_false>._M_head_impl =
         (tuple<pstore::repo::section_creation_dispatcher_*,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
          )(_Tuple_impl<0UL,_pstore::repo::section_creation_dispatcher_*,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
            )0x0;
    std::
    unique_ptr<pstore::repo::generic_section_creation_dispatcher,_std::default_delete<pstore::repo::generic_section_creation_dispatcher>_>
    ::~unique_ptr((unique_ptr<pstore::repo::generic_section_creation_dispatcher,_std::default_delete<pstore::repo::generic_section_creation_dispatcher>_>
                   *)&local_48);
    eVar4 = rule::pop(&this->super_rule);
  }
  if (local_40.has_error_ == false) {
    error_or<pstore::repo::section_content*>::
    value_storage_impl<pstore::error_or<pstore::repo::section_content*>&,pstore::repo::section_content*>
              (&local_40);
  }
  else {
    error_or<pstore::repo::section_content*>::
    error_storage_impl<pstore::error_or<pstore::repo::section_content*>&,std::error_code>(&local_40)
    ;
  }
  eVar4._4_4_ = 0;
  return eVar4;
}

Assistant:

std::error_code generic_section<OutputIterator>::end_object () {
                error_or<repo::section_content *> const c = this->content_object ();
                if (!c) {
                    return c.get_error ();
                }
                *out_ = std::make_unique<
                    repo::section_to_creation_dispatcher<repo::generic_section>::type> (kind_,
                                                                                        c.get ());
                return pop ();
            }